

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGraphVizWriter.cxx
# Opt level: O0

void __thiscall
cmGraphVizWriter::ReadSettings
          (cmGraphVizWriter *this,char *settingsFileName,char *fallbackSettingsFileName)

{
  Snapshot snapshot;
  bool bVar1;
  cmLocalGenerator *pcVar2;
  ostream *poVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  reference pbVar7;
  undefined1 local_d88 [8];
  RegularExpression currentRegex;
  string currentRegexString;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c90;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c88;
  const_iterator itvIt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignoreTargetsRegExVector;
  string local_c60;
  char *local_c40;
  char *value_11;
  string ignoreTargetsRegexes;
  string local_c10;
  allocator local_be9;
  string local_be8;
  char *local_bc8;
  char *value_10;
  string local_bb8;
  allocator local_b91;
  string local_b90;
  char *local_b70;
  char *value_9;
  string local_b60;
  allocator local_b39;
  string local_b38;
  char *local_b18;
  char *value_8;
  string local_b08;
  allocator local_ae1;
  string local_ae0;
  char *local_ac0;
  char *value_7;
  string local_ab0;
  allocator local_a89;
  string local_a88;
  char *local_a68;
  char *value_6;
  string local_a58;
  allocator local_a31;
  string local_a30;
  char *local_a10;
  char *value_5;
  string local_a00;
  allocator local_9d9;
  string local_9d8;
  char *local_9b8;
  char *value_4;
  string local_9a8;
  char *local_988;
  char *value_3;
  string local_978;
  char *local_958;
  char *value_2;
  string local_948;
  char *local_928;
  char *value_1;
  string local_918;
  char *local_8f8;
  char *value;
  char *local_8e8;
  char *inFileName;
  cmMakefile *mf;
  Snapshot local_8c8;
  auto_ptr<cmLocalGenerator> local_8b0;
  auto_ptr<cmLocalGenerator> lg;
  cmGlobalGenerator ggi;
  string local_2d8;
  allocator local_2a1;
  string local_2a0;
  undefined1 local_280 [8];
  cmake cm;
  char *fallbackSettingsFileName_local;
  char *settingsFileName_local;
  cmGraphVizWriter *this_local;
  
  cm.CurrentSnapshot.Position.Position = (PositionType)fallbackSettingsFileName;
  cmake::cmake((cmake *)local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2a0,"",&local_2a1);
  cmake::SetHomeDirectory((cmake *)local_280,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2d8,"",(allocator *)&ggi.field_0x5c7);
  cmake::SetHomeOutputDirectory((cmake *)local_280,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator((allocator<char> *)&ggi.field_0x5c7);
  cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)&lg,(cmake *)local_280);
  cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator((iterator *)&mf);
  cmState::Snapshot::Snapshot(&local_8c8,(cmState *)0x0,_mf);
  snapshot.Position.Tree = local_8c8.Position.Tree;
  snapshot.State = local_8c8.State;
  snapshot.Position.Position = local_8c8.Position.Position;
  pcVar2 = cmGlobalGenerator::MakeLocalGenerator
                     ((cmGlobalGenerator *)&lg,snapshot,(cmLocalGenerator *)0x0);
  cmsys::auto_ptr<cmLocalGenerator>::auto_ptr(&local_8b0,pcVar2);
  pcVar2 = cmsys::auto_ptr<cmLocalGenerator>::operator->(&local_8b0);
  inFileName = (char *)cmLocalGenerator::GetMakefile(pcVar2);
  local_8e8 = settingsFileName;
  bVar1 = cmsys::SystemTools::FileExists(settingsFileName);
  if (!bVar1) {
    local_8e8 = (char *)cm.CurrentSnapshot.Position.Position;
    bVar1 = cmsys::SystemTools::FileExists((char *)cm.CurrentSnapshot.Position.Position);
    if (!bVar1) {
      value._4_4_ = 1;
      goto LAB_0084c064;
    }
  }
  bVar1 = cmMakefile::ReadListFile((cmMakefile *)inFileName,local_8e8);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Reading GraphViz options file: ");
    poVar3 = std::operator<<(poVar3,local_8e8);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    pcVar4 = inFileName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_918,"GRAPHVIZ_GRAPH_TYPE",(allocator *)((long)&value_1 + 7));
    pcVar4 = cmMakefile::GetDefinition((cmMakefile *)pcVar4,&local_918);
    std::__cxx11::string::~string((string *)&local_918);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_1 + 7));
    local_8f8 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)this,pcVar4);
    }
    pcVar4 = inFileName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_948,"GRAPHVIZ_GRAPH_NAME",(allocator *)((long)&value_2 + 7));
    pcVar4 = cmMakefile::GetDefinition((cmMakefile *)pcVar4,&local_948);
    std::__cxx11::string::~string((string *)&local_948);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_2 + 7));
    local_928 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->GraphName,pcVar4);
    }
    pcVar4 = inFileName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_978,"GRAPHVIZ_GRAPH_HEADER",(allocator *)((long)&value_3 + 7));
    pcVar4 = cmMakefile::GetDefinition((cmMakefile *)pcVar4,&local_978);
    std::__cxx11::string::~string((string *)&local_978);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_3 + 7));
    local_958 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->GraphHeader,pcVar4);
    }
    pcVar4 = inFileName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_9a8,"GRAPHVIZ_NODE_PREFIX",(allocator *)((long)&value_4 + 7));
    pcVar4 = cmMakefile::GetDefinition((cmMakefile *)pcVar4,&local_9a8);
    std::__cxx11::string::~string((string *)&local_9a8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&value_4 + 7));
    local_988 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->GraphNodePrefix,pcVar4);
    }
    pcVar4 = inFileName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9d8,"GRAPHVIZ_EXECUTABLES",&local_9d9);
    pcVar5 = cmMakefile::GetDefinition((cmMakefile *)pcVar4,&local_9d8);
    std::__cxx11::string::~string((string *)&local_9d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
    pcVar4 = inFileName;
    local_9b8 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_a00,"GRAPHVIZ_EXECUTABLES",(allocator *)((long)&value_5 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)pcVar4,&local_a00);
      this->GenerateForExecutables = bVar1;
      std::__cxx11::string::~string((string *)&local_a00);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_5 + 7));
    }
    pcVar4 = inFileName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a30,"GRAPHVIZ_STATIC_LIBS",&local_a31);
    pcVar5 = cmMakefile::GetDefinition((cmMakefile *)pcVar4,&local_a30);
    std::__cxx11::string::~string((string *)&local_a30);
    std::allocator<char>::~allocator((allocator<char> *)&local_a31);
    pcVar4 = inFileName;
    local_a10 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_a58,"GRAPHVIZ_STATIC_LIBS",(allocator *)((long)&value_6 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)pcVar4,&local_a58);
      this->GenerateForStaticLibs = bVar1;
      std::__cxx11::string::~string((string *)&local_a58);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_6 + 7));
    }
    pcVar4 = inFileName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_a88,"GRAPHVIZ_SHARED_LIBS",&local_a89);
    pcVar5 = cmMakefile::GetDefinition((cmMakefile *)pcVar4,&local_a88);
    std::__cxx11::string::~string((string *)&local_a88);
    std::allocator<char>::~allocator((allocator<char> *)&local_a89);
    pcVar4 = inFileName;
    local_a68 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_ab0,"GRAPHVIZ_SHARED_LIBS",(allocator *)((long)&value_7 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)pcVar4,&local_ab0);
      this->GenerateForSharedLibs = bVar1;
      std::__cxx11::string::~string((string *)&local_ab0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_7 + 7));
    }
    pcVar4 = inFileName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_ae0,"GRAPHVIZ_MODULE_LIBS",&local_ae1);
    pcVar5 = cmMakefile::GetDefinition((cmMakefile *)pcVar4,&local_ae0);
    std::__cxx11::string::~string((string *)&local_ae0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ae1);
    pcVar4 = inFileName;
    local_ac0 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b08,"GRAPHVIZ_MODULE_LIBS",(allocator *)((long)&value_8 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)pcVar4,&local_b08);
      this->GenerateForModuleLibs = bVar1;
      std::__cxx11::string::~string((string *)&local_b08);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_8 + 7));
    }
    pcVar4 = inFileName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b38,"GRAPHVIZ_EXTERNAL_LIBS",&local_b39);
    pcVar5 = cmMakefile::GetDefinition((cmMakefile *)pcVar4,&local_b38);
    std::__cxx11::string::~string((string *)&local_b38);
    std::allocator<char>::~allocator((allocator<char> *)&local_b39);
    pcVar4 = inFileName;
    local_b18 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_b60,"GRAPHVIZ_EXTERNAL_LIBS",(allocator *)((long)&value_9 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)pcVar4,&local_b60);
      this->GenerateForExternals = bVar1;
      std::__cxx11::string::~string((string *)&local_b60);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_9 + 7));
    }
    pcVar4 = inFileName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_b90,"GRAPHVIZ_GENERATE_PER_TARGET",&local_b91);
    pcVar5 = cmMakefile::GetDefinition((cmMakefile *)pcVar4,&local_b90);
    std::__cxx11::string::~string((string *)&local_b90);
    std::allocator<char>::~allocator((allocator<char> *)&local_b91);
    pcVar4 = inFileName;
    local_b70 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_bb8,"GRAPHVIZ_GENERATE_PER_TARGET",
                 (allocator *)((long)&value_10 + 7));
      bVar1 = cmMakefile::IsOn((cmMakefile *)pcVar4,&local_bb8);
      this->GeneratePerTarget = bVar1;
      std::__cxx11::string::~string((string *)&local_bb8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&value_10 + 7));
    }
    pcVar4 = inFileName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_be8,"GRAPHVIZ_GENERATE_DEPENDERS",&local_be9);
    pcVar5 = cmMakefile::GetDefinition((cmMakefile *)pcVar4,&local_be8);
    std::__cxx11::string::~string((string *)&local_be8);
    std::allocator<char>::~allocator((allocator<char> *)&local_be9);
    pcVar4 = inFileName;
    local_bc8 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_c10,"GRAPHVIZ_GENERATE_DEPENDERS",
                 (allocator *)(ignoreTargetsRegexes.field_2._M_local_buf + 0xf));
      bVar1 = cmMakefile::IsOn((cmMakefile *)pcVar4,&local_c10);
      this->GenerateDependers = bVar1;
      std::__cxx11::string::~string((string *)&local_c10);
      std::allocator<char>::~allocator
                ((allocator<char> *)(ignoreTargetsRegexes.field_2._M_local_buf + 0xf));
    }
    std::__cxx11::string::string((string *)&value_11);
    pcVar4 = inFileName;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_c60,"GRAPHVIZ_IGNORE_TARGETS",
               (allocator *)
               ((long)&ignoreTargetsRegExVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar4 = cmMakefile::GetDefinition((cmMakefile *)pcVar4,&local_c60);
    std::__cxx11::string::~string((string *)&local_c60);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&ignoreTargetsRegExVector.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_c40 = pcVar4;
    if (pcVar4 != (char *)0x0) {
      std::__cxx11::string::operator=((string *)&value_11,pcVar4);
    }
    std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
              (&this->TargetsToIgnoreRegex);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&itvIt);
      cmSystemTools::ExpandListArgument
                ((string *)&value_11,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&itvIt,false);
      local_c90._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&itvIt);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
      ::__normal_iterator<std::__cxx11::string*>
                ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  *)&local_c88,&local_c90);
      while( true ) {
        currentRegexString.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&itvIt);
        bVar1 = __gnu_cxx::operator!=
                          (&local_c88,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&currentRegexString.field_2 + 8));
        if (!bVar1) break;
        pbVar7 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_c88);
        std::__cxx11::string::string((string *)&currentRegex.searchstring,(string *)pbVar7);
        cmsys::RegularExpression::RegularExpression((RegularExpression *)local_d88);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::RegularExpression::compile((RegularExpression *)local_d88,pcVar4);
        if (!bVar1) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Could not compile bad regex \"");
          poVar3 = std::operator<<(poVar3,(string *)&currentRegex.searchstring);
          poVar3 = std::operator<<(poVar3,"\"");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::push_back
                  (&this->TargetsToIgnoreRegex,(value_type *)local_d88);
        cmsys::RegularExpression::~RegularExpression((RegularExpression *)local_d88);
        std::__cxx11::string::~string((string *)&currentRegex.searchstring);
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_c88);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&itvIt);
    }
    std::__cxx11::string::~string((string *)&value_11);
    value._4_4_ = 0;
  }
  else {
    cmSystemTools::Error
              ("Problem opening GraphViz options file: ",local_8e8,(char *)0x0,(char *)0x0);
    value._4_4_ = 1;
  }
LAB_0084c064:
  cmsys::auto_ptr<cmLocalGenerator>::~auto_ptr(&local_8b0);
  cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&lg);
  cmake::~cmake((cmake *)local_280);
  return;
}

Assistant:

void cmGraphVizWriter::ReadSettings(const char* settingsFileName,
                                    const char* fallbackSettingsFileName)
{
  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cmGlobalGenerator ggi(&cm);
  cmsys::auto_ptr<cmLocalGenerator> lg(ggi.MakeLocalGenerator());
  cmMakefile *mf = lg->GetMakefile();

  const char* inFileName = settingsFileName;

  if ( !cmSystemTools::FileExists(inFileName) )
    {
    inFileName = fallbackSettingsFileName;
    if ( !cmSystemTools::FileExists(inFileName) )
      {
      return;
      }
    }

  if ( !mf->ReadListFile(inFileName) )
    {
    cmSystemTools::Error("Problem opening GraphViz options file: ",
                         inFileName);
    return;
    }

  std::cout << "Reading GraphViz options file: " << inFileName << std::endl;

#define __set_if_set(var, cmakeDefinition) \
  { \
  const char* value = mf->GetDefinition(cmakeDefinition); \
  if ( value ) \
    { \
    var = value; \
    } \
  }

  __set_if_set(this->GraphType, "GRAPHVIZ_GRAPH_TYPE");
  __set_if_set(this->GraphName, "GRAPHVIZ_GRAPH_NAME");
  __set_if_set(this->GraphHeader, "GRAPHVIZ_GRAPH_HEADER");
  __set_if_set(this->GraphNodePrefix, "GRAPHVIZ_NODE_PREFIX");

#define __set_bool_if_set(var, cmakeDefinition) \
  { \
  const char* value = mf->GetDefinition(cmakeDefinition); \
  if ( value ) \
    { \
    var = mf->IsOn(cmakeDefinition); \
    } \
  }

  __set_bool_if_set(this->GenerateForExecutables, "GRAPHVIZ_EXECUTABLES");
  __set_bool_if_set(this->GenerateForStaticLibs, "GRAPHVIZ_STATIC_LIBS");
  __set_bool_if_set(this->GenerateForSharedLibs, "GRAPHVIZ_SHARED_LIBS");
  __set_bool_if_set(this->GenerateForModuleLibs, "GRAPHVIZ_MODULE_LIBS");
  __set_bool_if_set(this->GenerateForExternals, "GRAPHVIZ_EXTERNAL_LIBS");
  __set_bool_if_set(this->GeneratePerTarget, "GRAPHVIZ_GENERATE_PER_TARGET");
  __set_bool_if_set(this->GenerateDependers, "GRAPHVIZ_GENERATE_DEPENDERS");

  std::string ignoreTargetsRegexes;
  __set_if_set(ignoreTargetsRegexes, "GRAPHVIZ_IGNORE_TARGETS");

  this->TargetsToIgnoreRegex.clear();
  if (!ignoreTargetsRegexes.empty())
    {
    std::vector<std::string> ignoreTargetsRegExVector;
    cmSystemTools::ExpandListArgument(ignoreTargetsRegexes,
                                      ignoreTargetsRegExVector);
    for(std::vector<std::string>::const_iterator itvIt
                                            = ignoreTargetsRegExVector.begin();
        itvIt != ignoreTargetsRegExVector.end();
        ++ itvIt )
      {
      std::string currentRegexString(*itvIt);
      cmsys::RegularExpression currentRegex;
      if (!currentRegex.compile(currentRegexString.c_str()))
        {
        std::cerr << "Could not compile bad regex \"" << currentRegexString
                  << "\"" << std::endl;
        }
      this->TargetsToIgnoreRegex.push_back(currentRegex);
      }
    }

}